

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorDisposer.cpp
# Opt level: O0

void __thiscall ApprovalTests::ComparatorDisposer::~ComparatorDisposer(ComparatorDisposer *this)

{
  shared_ptr<ApprovalTests::ApprovalComparator> *this_00;
  byte *in_RDI;
  key_type *in_stack_00000018;
  shared_ptr<ApprovalTests::ApprovalComparator> *in_stack_ffffffffffffffd8;
  
  if ((*in_RDI & 1) != 0) {
    this_00 = (shared_ptr<ApprovalTests::ApprovalComparator> *)(in_RDI + 0x30);
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>_>
                  *)this,in_stack_00000018);
    ::std::shared_ptr<ApprovalTests::ApprovalComparator>::operator=
              (this_00,in_stack_ffffffffffffffd8);
  }
  ::std::shared_ptr<ApprovalTests::ApprovalComparator>::~shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalComparator> *)0x16fd8a);
  ::std::__cxx11::string::~string((string *)(in_RDI + 0x10));
  return;
}

Assistant:

ComparatorDisposer::~ComparatorDisposer()
    {
        if (isActive)
        {
            comparators[ext_] = previousComparator;
        }
    }